

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
deleteOneWayReference
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_DeleteReferencesItem *item)

{
  bool bVar1;
  UA_Boolean UVar2;
  UA_ReferenceNode *p;
  UA_ReferenceNode *ref;
  size_t i;
  UA_Boolean edited;
  UA_DeleteReferencesItem *item_local;
  UA_Node *node_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  bVar1 = false;
  ref = (UA_ReferenceNode *)node->referencesSize;
  do {
    if (ref == (UA_ReferenceNode *)0x0) {
LAB_00144c56:
      if (bVar1) {
        if ((node->referencesSize == 0) && (node->references != (UA_ReferenceNode *)0x0)) {
          free(node->references);
          node->references = (UA_ReferenceNode *)0x0;
        }
        server_local._4_4_ = 0;
      }
      else {
        server_local._4_4_ = 0x40bc0000;
      }
      return server_local._4_4_;
    }
    p = node->references + (long)&ref[-1].targetId.field_0x2f;
    UVar2 = UA_NodeId_equal(&(item->targetNodeId).nodeId,&(p->targetId).nodeId);
    if (((UVar2) && (UVar2 = UA_NodeId_equal(&item->referenceTypeId,&p->referenceTypeId), UVar2)) &&
       ((item->isForward & 1U) != (p->isInverse & 1U))) {
      UA_ReferenceNode_deleteMembers(p);
      memcpy(node->references + (long)&ref[-1].targetId.field_0x2f,
             node->references + (node->referencesSize - 1),0x50);
      node->referencesSize = node->referencesSize - 1;
      bVar1 = true;
      goto LAB_00144c56;
    }
    ref = (UA_ReferenceNode *)&ref[-1].targetId.field_0x2f;
  } while( true );
}

Assistant:

static UA_StatusCode
deleteOneWayReference(UA_Server *server, UA_Session *session, UA_Node *node,
                      const UA_DeleteReferencesItem *item) {
    UA_Boolean edited = false;
    for(size_t i = node->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &node->references[i-1];
        if(!UA_NodeId_equal(&item->targetNodeId.nodeId, &ref->targetId.nodeId))
            continue;
        if(!UA_NodeId_equal(&item->referenceTypeId, &ref->referenceTypeId))
            continue;
        if(item->isForward == ref->isInverse)
            continue;
        UA_ReferenceNode_deleteMembers(ref);
        /* move the last entry to override the current position */
        node->references[i-1] = node->references[node->referencesSize-1];
        --node->referencesSize;
        edited = true;
        break;
    }
    if(!edited)
        return UA_STATUSCODE_UNCERTAINREFERENCENOTDELETED;
    /* we removed the last reference */
    if(node->referencesSize == 0 && node->references) {
        UA_free(node->references);
        node->references = NULL;
    }
    return UA_STATUSCODE_GOOD;;
}